

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleUnconnectedDriveDirective(Preprocessor *this,Token directive)

{
  SourceLocation SVar1;
  UnconnectedDriveDirectiveSyntax *syntax;
  Token TVar2;
  string_view sVar3;
  Token local_48;
  Token directive_local;
  Trivia local_28;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_48);
  TVar2 = peek(this);
  if ((TVar2._0_4_ & 0xfffe) == 0xf2) {
    local_48 = consume(this);
    this->unconnectedDrive = local_48.kind;
  }
  else {
  }
  if (local_48.info == (Info *)0x0) {
    SVar1 = Token::location(&directive_local);
    sVar3 = Token::rawText(&directive_local);
    SVar1 = (SourceLocation)((long)SVar1 + sVar3._M_len * 0x10000000);
    addDiag(this,(DiagCode)0x30004,SVar1);
    local_48 = Token::createMissing(this->alloc,Pull0Keyword,SVar1);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&directive_local,&local_48);
  Trivia::Trivia(&local_28,Directive,(SyntaxNode *)syntax);
  return local_28;
}

Assistant:

Trivia Preprocessor::handleUnconnectedDriveDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token strength;
    switch (peek().kind) {
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            strength = consume();
            unconnectedDrive = strength.kind;
            break;
        default:
            break;
    }

    if (!strength) {
        auto loc = directive.location() + directive.rawText().length();
        addDiag(diag::ExpectedDriveStrength, loc);
        strength = Token::createMissing(alloc, TokenKind::Pull0Keyword, loc);
    }

    auto result = alloc.emplace<UnconnectedDriveDirectiveSyntax>(directive, strength);
    return Trivia(TriviaKind::Directive, result);
}